

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O2

int __thiscall
zmq::thread_ctx_t::set(thread_ctx_t *this,int option_,void *optval_,size_t optvallen_)

{
  size_type sVar1;
  int *piVar2;
  int iVar3;
  int value;
  scoped_lock_t locker_4;
  string local_1b8 [32];
  scoped_lock_t locker;
  
  value = 0;
  if (optvallen_ == 4) {
    value = *optval_;
  }
  iVar3 = value;
  locker._mutex = &this->_opt_sync;
  switch(option_) {
  case 3:
    if (-1 < value && optvallen_ == 4) {
      mutex_t::lock(&this->_opt_sync);
      this->_thread_priority = iVar3;
LAB_001a19a8:
      scoped_lock_t::~scoped_lock_t(&locker);
      return 0;
    }
    break;
  case 4:
    if (-1 < value && optvallen_ == 4) {
      mutex_t::lock(&this->_opt_sync);
      this->_thread_sched_policy = iVar3;
      goto LAB_001a19a8;
    }
    break;
  case 7:
    if (-1 < value && optvallen_ == 4) {
      mutex_t::lock(&this->_opt_sync);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->_thread_affinity_cpus,&value);
      goto LAB_001a19a8;
    }
    break;
  case 8:
    if (-1 < value && optvallen_ == 4) {
      mutex_t::lock(&this->_opt_sync);
      sVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              erase(&(this->_thread_affinity_cpus)._M_t,&value);
      iVar3 = 0;
      if (sVar1 == 0) {
        piVar2 = __errno_location();
        *piVar2 = 0x16;
        iVar3 = -1;
      }
      scoped_lock_t::~scoped_lock_t(&locker);
      return iVar3;
    }
    break;
  case 9:
    if (optvallen_ == 4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&locker);
      std::ostream::operator<<((ostringstream *)&locker,value);
      locker_4._mutex = &this->_opt_sync;
      mutex_t::lock(&this->_opt_sync);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->_thread_name_prefix,local_1b8);
      std::__cxx11::string::~string(local_1b8);
      scoped_lock_t::~scoped_lock_t(&locker_4);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&locker);
      return 0;
    }
    if (optvallen_ - 1 < 0x10) {
      mutex_t::lock(&this->_opt_sync);
      std::__cxx11::string::assign((char *)&this->_thread_name_prefix,(ulong)optval_);
      goto LAB_001a19a8;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  return -1;
}

Assistant:

int zmq::thread_ctx_t::set (int option_, const void *optval_, size_t optvallen_)
{
    const bool is_int = (optvallen_ == sizeof (int));
    int value = 0;
    if (is_int)
        memcpy (&value, optval_, sizeof (int));

    switch (option_) {
        case ZMQ_THREAD_SCHED_POLICY:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                _thread_sched_policy = value;
                return 0;
            }
            break;

        case ZMQ_THREAD_AFFINITY_CPU_ADD:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                _thread_affinity_cpus.insert (value);
                return 0;
            }
            break;

        case ZMQ_THREAD_AFFINITY_CPU_REMOVE:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                if (0 == _thread_affinity_cpus.erase (value)) {
                    errno = EINVAL;
                    return -1;
                }
                return 0;
            }
            break;

        case ZMQ_THREAD_PRIORITY:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                _thread_priority = value;
                return 0;
            }
            break;

        case ZMQ_THREAD_NAME_PREFIX:
            // start_thread() allows max 16 chars for thread name
            if (is_int) {
                std::ostringstream s;
                s << value;
                scoped_lock_t locker (_opt_sync);
                _thread_name_prefix = s.str ();
                return 0;
            } else if (optvallen_ > 0 && optvallen_ <= 16) {
                scoped_lock_t locker (_opt_sync);
                _thread_name_prefix.assign (static_cast<const char *> (optval_),
                                            optvallen_);
                return 0;
            }
            break;
    }

    errno = EINVAL;
    return -1;
}